

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O3

void __thiscall adios2::aggregator::MPIShmChain::Close(MPIShmChain *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  if ((this->super_MPIAggregator).m_IsActive == true) {
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"free per-node comm in ~MPIShmChain()","");
    helper::Comm::Free(&this->m_NodeComm,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"free chain of nodes in ~MPIShmChain()","");
    helper::Comm::Free(&this->m_OnePerNodeComm,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"free comm of all aggregators in ~MPIShmChain()","");
    helper::Comm::Free(&this->m_AllAggregatorsComm,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"free chains of aggregators in ~MPIShmChain()","");
    helper::Comm::Free(&this->m_AggregatorChainComm,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  MPIAggregator::Close(&this->super_MPIAggregator);
  return;
}

Assistant:

void MPIShmChain::Close()
{
    if (m_IsActive)
    {
        m_NodeComm.Free("free per-node comm in ~MPIShmChain()");
        m_OnePerNodeComm.Free("free chain of nodes in ~MPIShmChain()");
        m_AllAggregatorsComm.Free("free comm of all aggregators in ~MPIShmChain()");
        m_AggregatorChainComm.Free("free chains of aggregators in ~MPIShmChain()");
    }
    MPIAggregator::Close();
}